

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quality_estimate.c
# Opt level: O1

int VP8EstimateQuality(uint8_t *data,size_t size)

{
  VP8StatusCode VVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  double dVar13;
  int q [4];
  WebPBitstreamFeatures features;
  int local_58 [4];
  WebPBitstreamFeatures local_48;
  
  if (data == (uint8_t *)0x0) {
    return -1;
  }
  VVar1 = WebPGetFeaturesInternal(data,size,&local_48,0x210);
  if (VVar1 == VP8_STATUS_OK) {
    if (local_48.format == 2) {
      return 0x65;
    }
    if ((local_48.format != 0) && (local_48.has_animation == 0)) {
      uVar4 = 0;
      uVar5 = 0;
      do {
        uVar7 = uVar5;
        uVar5 = size;
        if (size == uVar7) break;
        uVar3 = uVar4 >> 8;
        uVar5 = uVar7 + 1;
        uVar4 = uVar3 | (ulong)data[uVar7] << 0x28;
      } while ((uVar3 & 0xffffffffff000000 | (ulong)data[uVar7] << 0x28) != 0x2a019d000000);
      if (uVar7 < size) {
        if (size < uVar5 + 4) {
          return -1;
        }
        uVar5 = (uVar5 + 4) * 8 + 2;
        uVar4 = size << 3;
        if (uVar4 < uVar5) {
          uVar5 = 0x8000000000000000;
        }
        bVar10 = true;
        uVar7 = 0x8000000000000000;
        if (uVar5 < uVar4) {
          uVar7 = uVar5 | 1;
          bVar10 = -1 < (char)(data[uVar5 >> 3] << ((byte)uVar5 & 2));
        }
        iVar8 = -1;
        if (!bVar10) {
          bVar10 = true;
          bVar11 = true;
          uVar5 = 0x8000000000000000;
          if (uVar7 + 1 <= uVar4) {
            bVar11 = -1 < (char)(data[uVar7 >> 3] << ((byte)uVar7 & 7));
            uVar5 = uVar7 + 1;
          }
          uVar7 = 0x8000000000000000;
          if (uVar5 + 1 <= uVar4) {
            bVar10 = -1 < (char)(data[uVar5 >> 3] << ((byte)uVar5 & 7));
            uVar7 = uVar5 + 1;
          }
          iVar8 = -1;
          if (!bVar10) {
            bVar10 = true;
            uVar5 = 0x8000000000000000;
            if (uVar7 + 1 <= uVar4) {
              bVar10 = -1 < (char)(data[uVar7 >> 3] << ((byte)uVar7 & 7));
              uVar5 = uVar7 + 1;
            }
            local_58[0] = 0;
            local_58[1] = 0;
            local_58[2] = 0;
            local_58[3] = 0;
            lVar6 = 0;
            do {
              bVar12 = true;
              uVar7 = 0x8000000000000000;
              if (uVar5 + 1 <= uVar4) {
                bVar12 = -1 < (char)(data[uVar5 >> 3] << ((byte)uVar5 & 7));
                uVar7 = uVar5 + 1;
              }
              if (!bVar12) {
                iVar8 = 0;
                uVar5 = 0x8000000000000000;
                if (uVar7 + 7 <= uVar4) {
                  iVar8 = 0;
                  lVar9 = -7;
                  uVar3 = uVar7;
                  do {
                    iVar8 = (uint)((byte)(data[uVar3 >> 3] << ((byte)uVar3 & 7)) >> 7) + iVar8 * 2;
                    lVar9 = lVar9 + 1;
                    uVar3 = uVar3 + 1;
                    uVar5 = uVar7 + 7;
                  } while (lVar9 != 0);
                }
                local_58[lVar6] = iVar8;
                bVar12 = true;
                uVar7 = 0x8000000000000000;
                if (uVar5 + 1 <= uVar4) {
                  bVar12 = -1 < (char)(data[uVar5 >> 3] << ((byte)uVar5 & 7));
                  uVar7 = uVar5 + 1;
                }
                if (!bVar12) {
                  local_58[lVar6] = -iVar8;
                }
              }
              lVar6 = lVar6 + 1;
              uVar5 = uVar7;
            } while (lVar6 != 4);
            iVar8 = 4;
            do {
              bVar12 = true;
              uVar5 = 0x8000000000000000;
              if (uVar7 + 1 <= uVar4) {
                bVar12 = -1 < (char)(data[uVar7 >> 3] << ((byte)uVar7 & 7));
                uVar5 = uVar7 + 1;
              }
              uVar3 = 0x8000000000000000;
              if (uVar5 + 7 <= uVar4) {
                uVar3 = uVar5 + 7;
              }
              uVar7 = uVar5;
              if (!bVar12) {
                uVar7 = uVar3;
              }
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
            iVar8 = local_58[0];
            if (bVar10) {
              iVar8 = -1;
            }
          }
          if (!bVar11) {
            iVar2 = 3;
            do {
              bVar10 = true;
              uVar5 = 0x8000000000000000;
              if (uVar7 + 1 <= uVar4) {
                bVar10 = -1 < (char)(data[uVar7 >> 3] << ((byte)uVar7 & 7));
                uVar5 = uVar7 + 1;
              }
              uVar3 = 0x8000000000000000;
              if (uVar5 + 8 <= uVar4) {
                uVar3 = uVar5 + 8;
              }
              uVar7 = uVar5;
              if (!bVar10) {
                uVar7 = uVar3;
              }
              iVar2 = iVar2 + -1;
            } while (iVar2 != 0);
          }
        }
        uVar7 = uVar7 + 10;
        if (uVar4 < uVar7) {
          uVar7 = 0x8000000000000000;
        }
        bVar10 = true;
        uVar5 = 0x8000000000000000;
        if (uVar7 + 1 <= uVar4) {
          bVar10 = -1 < (char)(data[uVar7 >> 3] << ((byte)uVar7 & 7));
          uVar5 = uVar7 + 1;
        }
        if (!bVar10) {
          bVar10 = true;
          uVar7 = 0x8000000000000000;
          if (uVar5 + 1 <= uVar4) {
            bVar10 = -1 < (char)(data[uVar5 >> 3] << ((byte)uVar5 & 7));
            uVar7 = uVar5 + 1;
          }
          uVar5 = uVar7;
          if (!bVar10) {
            iVar2 = 8;
            do {
              bVar10 = true;
              uVar7 = 0x8000000000000000;
              if (uVar5 + 1 <= uVar4) {
                bVar10 = -1 < (char)(data[uVar5 >> 3] << ((byte)uVar5 & 7));
                uVar7 = uVar5 + 1;
              }
              uVar3 = 0x8000000000000000;
              if (uVar7 + 6 <= uVar4) {
                uVar3 = uVar7 + 6;
              }
              uVar5 = uVar7;
              if (!bVar10) {
                uVar5 = uVar3;
              }
              iVar2 = iVar2 + -1;
            } while (iVar2 != 0);
          }
        }
        uVar5 = uVar5 + 2;
        if (uVar4 < uVar5) {
          uVar5 = 0x8000000000000000;
        }
        iVar2 = 0;
        uVar7 = 0x8000000000000000;
        if (uVar5 + 7 <= uVar4) {
          iVar2 = 0;
          lVar6 = -7;
          uVar3 = uVar5;
          do {
            iVar2 = (uint)((byte)(data[uVar3 >> 3] << ((byte)uVar3 & 7)) >> 7) + iVar2 * 2;
            lVar6 = lVar6 + 1;
            uVar3 = uVar3 + 1;
            uVar7 = uVar5 + 7;
          } while (lVar6 != 0);
        }
        bVar11 = true;
        bVar10 = true;
        uVar5 = 0x8000000000000000;
        if (uVar7 + 1 <= uVar4) {
          bVar10 = -1 < (char)(data[uVar7 >> 3] << ((byte)uVar7 & 7));
          uVar5 = uVar7 + 1;
        }
        uVar7 = uVar5 + 5;
        if (uVar4 < uVar7) {
          uVar7 = 0x8000000000000000;
        }
        if (bVar10) {
          uVar7 = uVar5;
        }
        uVar5 = 0x8000000000000000;
        if (uVar7 + 1 <= uVar4) {
          bVar11 = -1 < (char)(data[uVar7 >> 3] << ((byte)uVar7 & 7));
          uVar5 = uVar7 + 1;
        }
        uVar7 = uVar5 + 5;
        if (uVar4 < uVar7) {
          uVar7 = 0x8000000000000000;
        }
        if (bVar11) {
          uVar7 = uVar5;
        }
        bVar11 = true;
        bVar10 = true;
        uVar5 = 0x8000000000000000;
        if (uVar7 + 1 <= uVar4) {
          bVar10 = -1 < (char)(data[uVar7 >> 3] << ((byte)uVar7 & 7));
          uVar5 = uVar7 + 1;
        }
        uVar7 = uVar5 + 5;
        if (uVar4 < uVar7) {
          uVar7 = 0x8000000000000000;
        }
        if (bVar10) {
          uVar7 = uVar5;
        }
        uVar5 = 0x8000000000000000;
        if (uVar7 + 1 <= uVar4) {
          bVar11 = -1 < (char)(data[uVar7 >> 3] << ((byte)uVar7 & 7));
          uVar5 = uVar7 + 1;
        }
        uVar7 = uVar5 + 5;
        if (uVar4 < uVar7) {
          uVar7 = 0x8000000000000000;
        }
        if (bVar11) {
          uVar7 = uVar5;
        }
        bVar10 = true;
        uVar5 = 0x8000000000000000;
        if (uVar7 + 1 <= uVar4) {
          bVar10 = -1 < (char)(data[uVar7 >> 3] << ((byte)uVar7 & 7));
          uVar5 = uVar7 + 1;
        }
        uVar7 = uVar5 + 5;
        if (uVar4 < uVar7) {
          uVar7 = 0x8000000000000000;
        }
        if (bVar10) {
          uVar7 = uVar5;
        }
        if (uVar7 == 0x8000000000000000) {
          return -1;
        }
        if (-1 < iVar8) {
          iVar2 = iVar8;
        }
        iVar8 = ((0x7f - iVar2) * 100) / 0x7f;
        if (iVar2 < 0x1a) {
          return iVar8;
        }
        dVar13 = pow((double)iVar8 / 80.0,2.6315789473684212);
        return (int)(dVar13 * 80.0);
      }
    }
  }
  return -1;
}

Assistant:

int VP8EstimateQuality(const uint8_t* const data, size_t size) {
  size_t pos = 0;
  uint64_t bit_pos;
  uint64_t sig = 0x00;
  int ok = 0;
  int Q = -1;
  WebPBitstreamFeatures features;

  if (data == NULL) return -1;

  if (WebPGetFeatures(data, size, &features) != VP8_STATUS_OK) {
    return -1;   // invalid file
  }
  if (features.format == 2) return 101;  // lossless
  if (features.format == 0 || features.has_animation) return -1;   // mixed

  while (pos < size) {
    sig = (sig >> 8) | ((uint64_t)data[pos++] << 40);
    if ((sig >> 24) == 0x2a019dull) {
      ok = 1;
      break;
    }
  }
  if (!ok) return -1;
  if (pos + 4 > size) return -1;

  // Skip main Header
  // width  = (data[pos + 0] | (data[pos + 1] << 8)) & 0x3fff;
  // height = (data[pos + 2] | (data[pos + 3] << 8)) & 0x3fff;
  pos += 4;
  bit_pos = pos * 8;

  GET_BIT(2);  // colorspace + clamp type

  // Segment header
  if (GET_BIT(1)) {       // use_segment
    int s;
    const int update_map = GET_BIT(1);
    if (GET_BIT(1)) {     // update data
      const int absolute_delta = GET_BIT(1);
      int q[4]  = { 0, 0, 0, 0 };
      for (s = 0; s < 4; ++s) {
        if (GET_BIT(1)) {
          q[s] = GET_BIT(7);
          if (GET_BIT(1)) q[s] = -q[s];   // sign
        }
      }
      if (absolute_delta) Q = q[0];  // just use the first segment's quantizer
      for (s = 0; s < 4; ++s) CONDITIONAL_SKIP(7);   //  filter strength
    }
    if (update_map) {
      for (s = 0; s < 3; ++s) CONDITIONAL_SKIP(8);
    }
  }
  // Filter header
  GET_BIT(1 + 6 + 3);     // simple + level + sharpness
  if (GET_BIT(1)) {       // use_lf_delta
    if (GET_BIT(1)) {     // update lf_delta?
      int n;
      for (n = 0; n < 4 + 4; ++n) CONDITIONAL_SKIP(6);
    }
  }
  // num partitions
  GET_BIT(2);

  // ParseQuant
  {
    const int base_q = GET_BIT(7);
    /* dqy1_dc = */ CONDITIONAL_SKIP(5);
    /* dqy2_dc = */ CONDITIONAL_SKIP(5);
    /* dqy2_ac = */ CONDITIONAL_SKIP(5);
    /* dquv_dc = */ CONDITIONAL_SKIP(5);
    /* dquv_ac = */ CONDITIONAL_SKIP(5);

    if (Q < 0) Q = base_q;
  }
  if (bit_pos == INVALID_BIT_POS) return -1;

  // base mapping
  Q = (127 - Q) * 100 / 127;
  // correction for power-law behavior in low range
  if (Q < 80) {
    Q = (int)(pow(Q / 80., 1. / 0.38) * 80);
  }
  return Q;
}